

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

void __thiscall
JsrtDebugManager::CallDebugEventCallback
          (JsrtDebugManager *this,JsDiagDebugEvent debugEvent,DynamicObject *eventDataObject,
          ScriptContext *scriptContext,bool isBreak)

{
  bool bVar1;
  ThreadContext *pTVar2;
  undefined1 local_70 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  AutoClear autoClear;
  
  if (scriptContext->threadContext->isScriptActive == true) {
    Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_70,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar2 = scriptContext->threadContext;
    bVar1 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    if (isBreak) {
      this->threadContext->debugManager->dispatchHaltFrameAddress = register0x00000020;
      __leaveScriptObject._32_8_ = this;
      (*this->debugEventCallback)(debugEvent,eventDataObject,this->callbackState);
      CallDebugEventCallback::AutoClear::~AutoClear
                ((AutoClear *)&__leaveScriptObject.__exceptionCheck);
    }
    else {
      (*this->debugEventCallback)(debugEvent,eventDataObject,this->callbackState);
    }
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar2->reentrancySafeOrHandled = bVar1;
    Js::LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_70);
  }
  else {
    if (!isBreak) {
      (*this->debugEventCallback)(debugEvent,eventDataObject,this->callbackState);
      return;
    }
    this->threadContext->debugManager->dispatchHaltFrameAddress = register0x00000020;
    local_70 = (undefined1  [8])this;
    (*this->debugEventCallback)(debugEvent,eventDataObject,this->callbackState);
    CallDebugEventCallback::AutoClear::~AutoClear((AutoClear *)local_70);
  }
  return;
}

Assistant:

void JsrtDebugManager::CallDebugEventCallback(JsDiagDebugEvent debugEvent, Js::DynamicObject* eventDataObject, Js::ScriptContext* scriptContext, bool isBreak)
{
    class AutoClear
    {
    public:
        AutoClear(JsrtDebugManager* jsrtDebug, void* dispatchHaltFrameAddress)
        {
            this->jsrtDebugManager = jsrtDebug;
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(dispatchHaltFrameAddress);
        }

        ~AutoClear()
        {
            if (jsrtDebugManager->debuggerObjectsManager != nullptr)
            {
                jsrtDebugManager->GetDebuggerObjectsManager()->ClearAll();
            }

            if (jsrtDebugManager->stackFrames != nullptr)
            {
                Adelete(jsrtDebugManager->GetDebugObjectArena(), jsrtDebugManager->stackFrames);
                jsrtDebugManager->stackFrames = nullptr;
            }
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(nullptr);
            this->jsrtDebugManager = nullptr;
        }
    private:
        JsrtDebugManager* jsrtDebugManager;
    };

    auto funcPtr = [&]()
    {
        if (isBreak)
        {
            void *frameAddress = _AddressOfReturnAddress();
            // If we are reporting break we should clear all objects after call returns

            // Save the frame address, when asking for stack we will only give stack which is under this address
            // because host can execute javascript after break which should not be part of stack.
            AutoClear autoClear(this, frameAddress);
            this->debugEventCallback(debugEvent, eventDataObject, this->callbackState);
        }
        else
        {
            this->debugEventCallback(debugEvent, eventDataObject, this->callbackState);
        }
    };

    if (scriptContext->GetThreadContext()->IsScriptActive())
    {
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            funcPtr();
        }
        END_LEAVE_SCRIPT(scriptContext);
    }
    else
    {
        funcPtr();
    }
}